

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  long lVar1;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar2;
  appender aVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  significand_type sVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  char cVar14;
  sign_t sVar15;
  int iVar16;
  uint uVar17;
  float_specs fVar18;
  ulong uVar19;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_e7 [15];
  long local_d8;
  undefined8 local_d0;
  undefined1 local_c4 [8];
  undefined4 uStack_bc;
  long local_b8;
  long local_b0 [2];
  char local_a0;
  void *local_98;
  basic_format_specs<char> *local_90;
  float_specs local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  char cStack_6c;
  undefined3 uStack_6b;
  int local_68;
  char cStack_64;
  undefined2 uStack_62;
  decimal_fp<float> *local_60;
  digit_grouping<char> *local_58;
  digit_grouping<char> *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  uVar17 = f->significand;
  uVar10 = 0x1f;
  if ((uVar17 | 1) != 0) {
    for (; (uVar17 | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar11 = (ulong)uVar17 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar10 * 8);
  uVar19 = uVar11 >> 0x20;
  iVar4 = (int)(uVar11 >> 0x20);
  local_e7[2] = 0x30;
  sVar15 = fspecs._5_1_;
  local_e7[1] = sVar15;
  local_e7._7_4_ = iVar4;
  local_e7._11_4_ = uVar17;
  local_80 = (undefined1  [8])fspecs;
  if ((long)uVar11 < 0) {
LAB_0022eae9:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/core.h"
                ,0x199,"negative value");
  }
  lVar5 = (uVar19 + 1) - (ulong)(sVar15 == none);
  local_e7[0] = '.';
  uVar10 = fspecs._4_4_;
  fVar18 = fspecs;
  if ((uVar10 >> 0x11 & 1) != 0) {
    local_d8 = lVar5;
    local_98 = loc.locale_;
    local_90 = specs;
    local_88 = fspecs;
    local_e7[0] = decimal_point_impl<char>(loc);
    lVar5 = local_d8;
    specs = local_90;
    loc.locale_ = local_98;
    fVar18 = local_88;
  }
  uVar9 = f->exponent;
  sVar8 = uVar9 + iVar4;
  iVar16 = fVar18.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0022e82b:
    iVar12 = uVar9 + iVar4 + -1;
    if ((uVar10 >> 0x13 & 1) == 0) {
      uVar11 = 0;
      if (iVar4 == 1) {
        local_e7[0] = '\0';
        uVar11 = 0;
      }
    }
    else {
      uVar11 = 0;
      if (0 < iVar16 - iVar4) {
        uVar11 = (ulong)(uint)(iVar16 - iVar4);
      }
      lVar5 = lVar5 + uVar11;
    }
    local_78[0] = sVar15;
    local_78._4_4_ = uVar17;
    cStack_6c = local_e7[0];
    local_78._8_4_ = iVar4;
    _local_68 = CONCAT14('0',(int)uVar11);
    _local_68 = CONCAT26(uStack_62,CONCAT15(((uVar10 >> 0x10 & 1) == 0) << 5,_local_68)) |
                0x450000000000;
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar12);
    if (0 < specs->width) {
      if ((int)sVar8 < 1) {
        iVar12 = 1 - sVar8;
      }
      lVar1 = 2;
      if (99 < iVar12) {
        lVar1 = (ulong)(999 < iVar12) + 3;
      }
      sVar6 = lVar5 + (3 - (ulong)(local_e7[0] == '\0')) + lVar1;
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,sVar6,sVar6,(anon_class_28_8_ad0ecca5 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    aVar3 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_28_8_ad0ecca5::operator()
                      ((anon_class_28_8_ad0ecca5 *)local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar12 = 0x10;
    if (0 < iVar16) {
      iVar12 = iVar16;
    }
    if (((int)sVar8 < -3) || (iVar12 < (int)sVar8)) goto LAB_0022e82b;
  }
  local_c4._0_4_ = sVar8;
  if ((int)uVar9 < 0) {
    if ((int)sVar8 < 1) {
      iVar4 = -sVar8;
      local_c4._4_4_ = iVar4;
      if (SBORROW4(iVar16,iVar4) != (int)(iVar16 + sVar8) < 0) {
        local_c4._4_4_ = iVar16;
      }
      if (iVar16 < 0) {
        local_c4._4_4_ = iVar4;
      }
      if (uVar19 != 0) {
        local_c4._4_4_ = iVar4;
      }
      if (local_c4._4_4_ == 0 && uVar19 == 0) {
        local_e7[3] = (char)((uVar10 & 0x80000) >> 0x13);
        iVar4 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_e7[3] = 1;
        iVar4 = 2;
        if ((int)local_c4._4_4_ < 0) goto LAB_0022eae9;
      }
      sVar6 = lVar5 + (ulong)(uint)(iVar4 + local_c4._4_4_);
      local_78._0_8_ = local_e7 + 1;
      unique0x00004e80 = local_e7 + 2;
      _local_68 = local_e7 + 3;
      local_60 = (decimal_fp<float> *)local_e7;
      local_58 = (digit_grouping<char> *)(local_c4 + 4);
      local_50 = (digit_grouping<char> *)(local_e7 + 0xb);
      local_48 = (int *)(local_e7 + 7);
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,sVar6,sVar6,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    uVar9 = 0;
    local_e7._3_4_ = iVar16 - iVar4 & (int)(uVar10 << 0xc) >> 0x1f;
    uVar17 = local_e7._3_4_;
    if ((int)local_e7._3_4_ < 1) {
      uVar17 = uVar9;
    }
    local_d8 = lVar5;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_c4 + 4),loc,(bool)((byte)(uVar10 >> 0x11) & 1));
    if (local_a0 != '\0') {
      pcVar13 = (char *)CONCAT44(uStack_bc,local_c4._4_4_);
      pcVar7 = pcVar13 + local_b8;
      lVar5 = 0;
      do {
        if (pcVar13 == pcVar7) {
          cVar14 = pcVar7[-1];
          pcVar13 = pcVar7;
        }
        else {
          cVar14 = *pcVar13;
          if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_0022eb06;
          pcVar13 = pcVar13 + 1;
        }
        uVar9 = uVar9 + (int)cVar14;
        if ((int)local_e7._7_4_ <= (int)uVar9) goto LAB_0022eb06;
        lVar5 = lVar5 + 1;
      } while( true );
    }
    lVar5 = 0;
LAB_0022eb06:
    sVar6 = (ulong)uVar17 + local_d8 + lVar5 + 1;
    local_78._0_8_ = local_e7 + 1;
    unique0x00004e80 = local_e7 + 0xb;
    _local_68 = local_e7 + 7;
    local_60 = (decimal_fp<float> *)local_c4;
    local_58 = (digit_grouping<char> *)local_e7;
    local_48 = (int *)(local_e7 + 3);
    local_40 = (int *)(local_e7 + 2);
    local_50 = (digit_grouping<char> *)(local_c4 + 4);
    bVar2.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   (out,specs,sVar6,sVar6,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_0022eb69;
  }
  lVar5 = lVar5 + (ulong)uVar9;
  local_e7._3_4_ = iVar16 - sVar8;
  if ((uVar10 >> 0x13 & 1) != 0) {
    lVar5 = lVar5 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e7._3_4_) {
      if ((int)local_e7._3_4_ < 1) goto LAB_0022e9d9;
    }
    else {
      local_e7._3_4_ = 1;
    }
    lVar5 = lVar5 + (ulong)(uint)local_e7._3_4_;
  }
LAB_0022e9d9:
  local_d0 = f;
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_c4 + 4),loc,(bool)((byte)(uVar10 >> 0x11) & 1));
  iVar4 = 0;
  if (local_a0 != '\0') {
    pcVar13 = (char *)CONCAT44(uStack_bc,local_c4._4_4_);
    pcVar7 = pcVar13 + local_b8;
    lVar1 = 0;
    do {
      if (pcVar13 == pcVar7) {
        cVar14 = pcVar7[-1];
        pcVar13 = pcVar7;
      }
      else {
        cVar14 = *pcVar13;
        if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_0022ea46;
        pcVar13 = pcVar13 + 1;
      }
      iVar4 = iVar4 + cVar14;
      if ((int)sVar8 <= iVar4) goto LAB_0022ea46;
      lVar1 = lVar1 + 1;
    } while( true );
  }
  lVar1 = 0;
LAB_0022ea46:
  local_78._0_8_ = local_e7 + 1;
  unique0x00004e80 = local_e7 + 0xb;
  _local_68 = local_e7 + 7;
  local_60 = (decimal_fp<float> *)local_d0;
  local_50 = (digit_grouping<char> *)local_80;
  local_48 = (int *)local_e7;
  local_40 = (int *)(local_e7 + 3);
  local_38 = local_e7 + 2;
  local_58 = (digit_grouping<char> *)(local_c4 + 4);
  bVar2.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 (out,specs,lVar5 + lVar1,lVar5 + lVar1,(anon_class_72_9_0c6a3a8a *)local_78);
LAB_0022eb69:
  if ((long *)CONCAT44(uStack_bc,local_c4._4_4_) != local_b0) {
    operator_delete((long *)CONCAT44(uStack_bc,local_c4._4_4_),local_b0[0] + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}